

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O1

FT_Error ft_stroker_subpath_start(FT_Stroker stroker,FT_Angle start_angle,FT_Fixed line_length)

{
  FT_Error FVar1;
  undefined1 local_48 [8];
  FT_Vector point;
  FT_Vector delta;
  
  FT_Vector_From_Polar((FT_Vector *)&point.y,stroker->radius,start_angle + 0x5a0000);
  local_48 = (undefined1  [8])(point.y + (stroker->center).x);
  point.x = delta.x + (stroker->center).y;
  FVar1 = ft_stroke_border_moveto(stroker->borders,(FT_Vector *)local_48);
  if (FVar1 == 0) {
    local_48 = (undefined1  [8])((stroker->center).x - point.y);
    point.x = (stroker->center).y - delta.x;
    FVar1 = ft_stroke_border_moveto(stroker->borders + 1,(FT_Vector *)local_48);
    stroker->subpath_angle = start_angle;
    stroker->first_point = '\0';
    stroker->subpath_line_length = line_length;
  }
  return FVar1;
}

Assistant:

static FT_Error
  ft_stroker_subpath_start( FT_Stroker  stroker,
                            FT_Angle    start_angle,
                            FT_Fixed    line_length )
  {
    FT_Vector        delta;
    FT_Vector        point;
    FT_Error         error;
    FT_StrokeBorder  border;


    FT_Vector_From_Polar( &delta, stroker->radius,
                          start_angle + FT_ANGLE_PI2 );

    point.x = stroker->center.x + delta.x;
    point.y = stroker->center.y + delta.y;

    border = stroker->borders;
    error = ft_stroke_border_moveto( border, &point );
    if ( error )
      goto Exit;

    point.x = stroker->center.x - delta.x;
    point.y = stroker->center.y - delta.y;

    border++;
    error = ft_stroke_border_moveto( border, &point );

    /* save angle, position, and line length for last join */
    /* (line_length is zero for curves)                    */
    stroker->subpath_angle       = start_angle;
    stroker->first_point         = FALSE;
    stroker->subpath_line_length = line_length;

  Exit:
    return error;
  }